

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

ShapeRange * __thiscall
CoreML::ShapeRange::operator+(ShapeRange *__return_storage_ptr__,ShapeRange *this,size_t val)

{
  RangeValue local_28;
  
  ShapeRange(__return_storage_ptr__);
  RangeValue::RangeValue(&local_28);
  if ((this->_minimum)._isUnbound == false) {
    local_28._val = (this->_minimum)._val + val;
    local_28._isUnbound = false;
  }
  setLower(__return_storage_ptr__,&local_28);
  RangeValue::RangeValue(&local_28);
  if ((this->_maximum)._isUnbound == false) {
    local_28._val = val + (this->_maximum)._val;
    local_28._isUnbound = false;
  }
  setUpper(__return_storage_ptr__,&local_28);
  return __return_storage_ptr__;
}

Assistant:

ShapeRange ShapeRange::operator+ (size_t val) const {
    ShapeRange out;
    out.setLower(_minimum + val);
    out.setUpper(_maximum + val);
    return out;
}